

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_PlaneSurface::Reverse(ON_PlaneSurface *this,int dir)

{
  ON_3dVector local_38;
  
  if ((uint)dir < 2) {
    ON_Interval::Reverse((ON_Interval *)(&this->field_0xb0 + (ulong)(uint)dir * 0x10));
    ON_Interval::Reverse((ON_Interval *)(&this->field_0x90 + (ulong)(uint)dir * 0x10));
    if (dir == 0) {
      ON_3dVector::operator-(&local_38,&(this->m_plane).xaxis);
      (this->m_plane).xaxis.z = local_38.z;
      (this->m_plane).xaxis.x = local_38.x;
      (this->m_plane).xaxis.y = local_38.y;
    }
    else {
      ON_3dVector::operator-(&local_38,&(this->m_plane).yaxis);
      (this->m_plane).yaxis.z = local_38.z;
      (this->m_plane).yaxis.x = local_38.x;
      (this->m_plane).yaxis.y = local_38.y;
    }
    ON_3dVector::operator-(&local_38,&(this->m_plane).zaxis);
    (this->m_plane).zaxis.z = local_38.z;
    (this->m_plane).zaxis.x = local_38.x;
    (this->m_plane).zaxis.y = local_38.y;
    ON_Plane::UpdateEquation(&this->m_plane);
  }
  return (uint)dir < 2;
}

Assistant:

bool
ON_PlaneSurface::Reverse( int dir )
{
  if ( dir < 0 || dir > 1 )
    return false;
  m_extents[dir].Reverse();
  m_domain[dir].Reverse();
  if (dir)
    m_plane.yaxis = -m_plane.yaxis;
  else
    m_plane.xaxis = -m_plane.xaxis;
  m_plane.zaxis = -m_plane.zaxis;
  m_plane.UpdateEquation();
  return true;
}